

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O1

void __thiscall CTcMake::get_srcfile(CTcMake *this,textchar_t *dst,CTcMakeModule *mod)

{
  textchar_t *ptVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *filename;
  char *pcVar5;
  textchar_t *__name;
  size_t __n;
  CTcMakePath *pCVar6;
  
  pcVar3 = (mod->search_src_).buf_;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "";
  }
  pcVar5 = (mod->src_).buf_;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = "";
  }
  if (*pcVar3 != '\0') {
    pcVar5 = pcVar3;
  }
  iVar2 = os_is_file_absolute(pcVar5);
  __name = (mod->src_).buf_;
  if (__name == (textchar_t *)0x0) {
    __name = "";
  }
  if (iVar2 == 0) {
    iVar2 = access(__name,0);
    pCVar6 = this->src_head_;
    if (pCVar6 != (CTcMakePath *)0x0 && iVar2 != 0) {
      do {
        pcVar3 = (pCVar6->path_).buf_;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = "";
        }
        pcVar5 = (mod->search_src_).buf_;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = "";
        }
        filename = (mod->src_).buf_;
        if (filename == (char *)0x0) {
          filename = "";
        }
        if (*pcVar5 != '\0') {
          filename = pcVar5;
        }
        os_build_full_path(dst,0x1000,pcVar3,filename);
        iVar2 = access(dst,0);
        if (iVar2 == 0) {
          return;
        }
        pCVar6 = pCVar6->nxt_;
      } while (pCVar6 != (CTcMakePath *)0x0);
    }
    ptVar1 = (mod->src_).buf_;
    __name = "";
    if (ptVar1 != (textchar_t *)0x0) {
      __name = ptVar1;
    }
  }
  sVar4 = strlen(__name);
  __n = 0xfff;
  if (sVar4 < 0xfff) {
    __n = sVar4;
  }
  memcpy(dst,__name,__n);
  dst[__n] = '\0';
  return;
}

Assistant:

void CTcMake::get_srcfile(textchar_t *dst, CTcMakeModule *mod)
{
    CTcMakePath *path;
    
    /* 
     *   if the file has an absolute path already, use the name without
     *   further modification; otherwise, apply our default path 
     */
    if (os_is_file_absolute(mod->get_search_source_name()))
    {
        /* it's absolute - ignore the search path */
        lib_strcpy(dst, OSFNMAX, mod->get_source_name());
        return;
    }

    /*
     *   If the file exists with the name as given (in other words, relative
     *   to the current working directory), use the name as given. 
     */
    if (!osfacc(mod->get_source_name()))
    {
        /* the file exists in the current directory - use the name as given */
        lib_strcpy(dst, OSFNMAX, mod->get_source_name());
        return;
    }

    /* search the source path for the file */
    for (path = src_head_ ; path != 0 ; path = path->get_next())
    {
        /* build the full path for this source path */
        os_build_full_path(dst, OSFNMAX, path->get_path(),
                           mod->get_search_source_name());

        /* if the resulting file exists, return it */
        if (!osfacc(dst))
            return;
    }

    /* 
     *   we failed to find the file anywhere - return the name as given,
     *   which will let the caller fail when it can't open the file 
     */
    lib_strcpy(dst, OSFNMAX, mod->get_source_name());
}